

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall ipx::Model::EquilibrateMatrix(Model *this)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  size_t sVar8;
  double *pdVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  double *pdVar17;
  void *__s;
  void *__s_00;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  size_t sVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int exp_2;
  int exp_1;
  int exp;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar18;
  
  uVar2 = (this->A_).nrow_;
  sVar23 = (size_t)(int)uVar2;
  piVar4 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->A_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colscale_)._M_size != 0) {
    operator_delete((this->colscale_)._M_data);
    (this->colscale_)._M_size = 0;
    pdVar17 = (double *)operator_new(0);
    (this->colscale_)._M_data = pdVar17;
  }
  uVar13 = (int)((ulong)((long)piVar5 - (long)piVar4) >> 2) - 1;
  uVar18 = (ulong)uVar13;
  if ((this->rowscale_)._M_size != 0) {
    operator_delete((this->rowscale_)._M_data);
    (this->rowscale_)._M_size = 0;
    pdVar17 = (double *)operator_new(0);
    (this->rowscale_)._M_data = pdVar17;
  }
  sVar21 = (size_t)(int)uVar13;
  iVar16 = piVar4[sVar21];
  if ((long)iVar16 < 1) {
    return;
  }
  lVar22 = 0;
  while (frexp((double)((ulong)pdVar7[lVar22] & (ulong)DAT_003bf3e0),(int *)&local_4c), local_4c < 4
        ) {
    lVar22 = lVar22 + 1;
    if (iVar16 == lVar22) {
      return;
    }
  }
  pdVar17 = (this->colscale_)._M_data;
  if ((this->colscale_)._M_size != sVar21) {
    operator_delete(pdVar17);
    (this->colscale_)._M_size = sVar21;
    pdVar17 = (double *)operator_new(sVar21 * 8);
    (this->colscale_)._M_data = pdVar17;
  }
  if (uVar13 != 0) {
    memset(pdVar17,0,sVar21 * 8);
  }
  pdVar17 = (this->rowscale_)._M_data;
  if ((this->rowscale_)._M_size != sVar23) {
    operator_delete(pdVar17);
    (this->rowscale_)._M_size = sVar23;
    pdVar17 = (double *)operator_new(sVar23 * 8);
    (this->rowscale_)._M_data = pdVar17;
  }
  if (uVar2 != 0) {
    memset(pdVar17,0,sVar23 * 8);
  }
  auVar12 = _DAT_003beea0;
  auVar11 = _DAT_003bee90;
  sVar8 = (this->colscale_)._M_size;
  if (sVar8 != 0) {
    pdVar9 = (this->colscale_)._M_data;
    lVar22 = sVar8 - 1;
    auVar25._8_4_ = (int)lVar22;
    auVar25._0_8_ = lVar22;
    auVar25._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar19 = 0;
    auVar25 = auVar25 ^ _DAT_003beea0;
    do {
      auVar28._8_4_ = (int)uVar19;
      auVar28._0_8_ = uVar19;
      auVar28._12_4_ = (int)(uVar19 >> 0x20);
      auVar28 = (auVar28 | auVar11) ^ auVar12;
      if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                  auVar25._4_4_ < auVar28._4_4_) & 1)) {
        pdVar9[uVar19] = 1.0;
      }
      if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
          auVar28._12_4_ <= auVar25._12_4_) {
        pdVar9[uVar19 + 1] = 1.0;
      }
      uVar19 = uVar19 + 2;
    } while ((sVar8 + 1 & 0xfffffffffffffffe) != uVar19);
  }
  auVar12 = _DAT_003beea0;
  auVar11 = _DAT_003bee90;
  sVar8 = (this->rowscale_)._M_size;
  if (sVar8 != 0) {
    lVar22 = sVar8 - 1;
    auVar26._8_4_ = (int)lVar22;
    auVar26._0_8_ = lVar22;
    auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar19 = 0;
    auVar26 = auVar26 ^ _DAT_003beea0;
    do {
      auVar29._8_4_ = (int)uVar19;
      auVar29._0_8_ = uVar19;
      auVar29._12_4_ = (int)(uVar19 >> 0x20);
      auVar25 = (auVar29 | auVar11) ^ auVar12;
      if ((bool)(~(auVar25._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar25._0_4_ ||
                  auVar26._4_4_ < auVar25._4_4_) & 1)) {
        pdVar17[uVar19] = 1.0;
      }
      if ((auVar25._12_4_ != auVar26._12_4_ || auVar25._8_4_ <= auVar26._8_4_) &&
          auVar25._12_4_ <= auVar26._12_4_) {
        pdVar17[uVar19 + 1] = 1.0;
      }
      uVar19 = uVar19 + 2;
    } while ((sVar8 + 1 & 0xfffffffffffffffe) != uVar19);
  }
  __s = operator_new(sVar21 << 3);
  iVar16 = 0;
  memset(__s,0,sVar21 << 3);
  uVar19 = sVar23 * 8;
  __s_00 = operator_new(uVar19);
  local_40 = uVar19;
  memset(__s_00,0,uVar19);
  local_38 = (ulong)uVar2;
  local_48 = -uVar18;
  do {
    while( true ) {
      if (uVar2 != 0) {
        memset(__s_00,0,local_40);
      }
      if ((int)uVar13 < 1) break;
      uVar19 = 0;
      iVar14 = *piVar4;
      do {
        *(undefined8 *)((long)__s + uVar19 * 8) = 0;
        iVar3 = piVar4[uVar19 + 1];
        if (iVar14 < iVar3) {
          lVar22 = (long)iVar14;
          dVar24 = 0.0;
          do {
            lVar20 = (long)piVar6[lVar22];
            dVar27 = ABS(pdVar7[lVar22]);
            dVar1 = dVar27;
            if (dVar27 <= dVar24) {
              dVar1 = dVar24;
            }
            dVar24 = dVar1;
            *(double *)((long)__s + uVar19 * 8) = dVar24;
            dVar1 = *(double *)((long)__s_00 + lVar20 * 8);
            if (dVar27 <= dVar1) {
              dVar27 = dVar1;
            }
            *(double *)((long)__s_00 + lVar20 * 8) = dVar27;
            lVar22 = lVar22 + 1;
          } while (iVar3 != lVar22);
        }
        uVar19 = uVar19 + 1;
        iVar14 = iVar3;
      } while (uVar19 != uVar18);
      if (0 < (int)uVar2) goto LAB_003acd8b;
      if ((int)uVar13 < 1) goto LAB_003acf8f;
      bVar10 = false;
LAB_003ace2e:
      lVar22 = 0;
      do {
        while( true ) {
          lVar20 = lVar22 + 1;
          frexp(*(double *)((long)__s + lVar20 * 8 + -8),(int *)&local_54);
          if ((int)local_54 < 0) break;
          if (3 < local_54) {
            uVar15 = -(local_54 - 2 >> 1);
            goto LAB_003ace66;
          }
          *(undefined8 *)((long)__s + lVar20 * 8 + -8) = 0x3ff0000000000000;
LAB_003ace97:
          lVar22 = lVar20;
          if (local_48 + lVar20 == 0) {
            if (!bVar10) goto LAB_003acf8f;
            goto LAB_003acf03;
          }
        }
        uVar15 = 1 - local_54 >> 1;
LAB_003ace66:
        dVar24 = ldexp(1.0,uVar15);
        *(double *)((long)__s + lVar20 * 8 + -8) = dVar24;
        if ((dVar24 == 1.0) && (!NAN(dVar24))) goto LAB_003ace97;
        pdVar17 = (this->colscale_)._M_data;
        pdVar17[lVar22] = dVar24 * pdVar17[lVar22];
        bVar10 = true;
        lVar22 = lVar20;
      } while (local_48 + lVar20 != 0);
LAB_003acf03:
      if (0 < (int)uVar13) {
        uVar19 = 0;
        iVar14 = *piVar4;
        do {
          iVar3 = piVar4[uVar19 + 1];
          if (iVar14 < iVar3) {
            lVar22 = (long)iVar14;
            dVar24 = *(double *)((long)__s + uVar19 * 8);
            do {
              pdVar7[lVar22] =
                   pdVar7[lVar22] * dVar24 * *(double *)((long)__s_00 + (long)piVar6[lVar22] * 8);
              lVar22 = lVar22 + 1;
            } while (iVar3 != lVar22);
          }
          uVar19 = uVar19 + 1;
          iVar14 = iVar3;
        } while (uVar19 != uVar18);
      }
      iVar16 = iVar16 + 1;
      if (iVar16 == 10) goto LAB_003acf8f;
    }
    if ((int)uVar2 < 1) break;
LAB_003acd8b:
    uVar19 = 0;
    bVar10 = false;
    do {
      frexp(*(double *)((long)__s_00 + uVar19 * 8),(int *)&local_50);
      if ((int)local_50 < 0) {
        uVar15 = 1 - local_50 >> 1;
LAB_003acdc8:
        dVar24 = ldexp(1.0,uVar15);
        *(double *)((long)__s_00 + uVar19 * 8) = dVar24;
        if ((dVar24 != 1.0) || (NAN(dVar24))) {
          pdVar17 = (this->rowscale_)._M_data;
          pdVar17[uVar19] = dVar24 * pdVar17[uVar19];
          bVar10 = true;
        }
      }
      else {
        if (3 < local_50) {
          uVar15 = -(local_50 - 2 >> 1);
          goto LAB_003acdc8;
        }
        *(undefined8 *)((long)__s_00 + uVar19 * 8) = 0x3ff0000000000000;
      }
      uVar19 = uVar19 + 1;
    } while (local_38 != uVar19);
    if (0 < (int)uVar13) goto LAB_003ace2e;
    iVar16 = iVar16 + 1;
  } while ((bool)(bVar10 & iVar16 != 10));
LAB_003acf8f:
  operator_delete(__s_00);
  operator_delete(__s);
  return;
}

Assistant:

void Model::EquilibrateMatrix() {
    const Int m = A_.rows();
    const Int n = A_.cols();
    const Int* Ap = A_.colptr();
    const Int* Ai = A_.rowidx();
    double* Ax = A_.values();

    colscale_.resize(0);
    rowscale_.resize(0);

    // The absolute value of each nonzero entry of AI can be written as x*2^exp
    // with x in the range [0.5,1). We consider AI well scaled if each entry is
    // such that expmin <= exp <= expmax for parameters expmin and expmax.
    // For example,
    //
    //  expmin  expmax  allowed range
    //  -----------------------------
    //       0       2    [0.5,    4)
    //      -1       3    [0.25,   8)
    //       1       7    [1.0,  128)
    //
    // If AI is not well scaled, a recursive row and column equilibration is
    // applied. In each iteration, the scaling factors are roughly 1/sqrt(max),
    // where max is the maximum row or column entry. However, the factors are
    // truncated to powers of 2, so that no round-off errors occur.

    constexpr int expmin = 0;
    constexpr int expmax = 3;
    constexpr Int maxround = 10;

    // Quick return if entries are within the target range.
    bool out_of_range = false;
    for (Int p = 0; p < Ap[n]; p++) {
        int exp;
        std::frexp(std::abs(Ax[p]), &exp);
        if (exp < expmin || exp > expmax) {
            out_of_range = true;
            break;
        }
    }
    if (!out_of_range)
        return;

    colscale_.resize(n);
    rowscale_.resize(m);
    colscale_ = 1.0;
    rowscale_ = 1.0;
    Vector colmax(n), rowmax(m);

    for (Int round = 0; round < maxround; round++) {
        // Compute infinity norm of each row and column.
        rowmax = 0.0;
        for (Int j = 0; j < n; j++) {
            colmax[j] = 0.0;
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Int i = Ai[p];
                double xa = std::abs(Ax[p]);
                colmax[j] = std::max(colmax[j], xa);
                rowmax[i] = std::max(rowmax[i], xa);
            }
        }
        // Replace rowmax and colmax entries by scaling factors from this round.
        bool out_of_range = false;
        for (Int i = 0; i < m; i++) {
            int exp;
            std::frexp(rowmax[i], &exp);
            rowmax[i] = EquilibrationFactor(expmin, expmax, exp);
            if (rowmax[i] != 1.0) {
                out_of_range = true;
                rowscale_[i] *= rowmax[i];
            }
        }
        for (Int j = 0; j < n; j++) {
            int exp;
            std::frexp(colmax[j], &exp);
            colmax[j] = EquilibrationFactor(expmin, expmax, exp);
            if (colmax[j] != 1.0) {
                out_of_range = true;
                colscale_[j] *= colmax[j];
            }
        }
        if (!out_of_range)
            break;
        // Rescale A.
        for (Int j = 0; j < n; j++) {
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Ax[p] *= colmax[j];     // column scaling
                Ax[p] *= rowmax[Ai[p]]; // row scaling
            }
        }
    }
}